

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIRResampler.cpp
# Opt level: O2

void __thiscall
SRCTools::FIRResampler::Constants::Constants
          (Constants *this,uint upsampleFactor,double downsampleFactor,FIRCoefficient *kernel,
          uint kernelLength)

{
  FloatSample *pFVar1;
  ulong __n;
  uint uVar2;
  FIRCoefficient *__dest;
  FloatSample *pFVar3;
  uint uVar4;
  double dVar5;
  
  dVar5 = floor(downsampleFactor);
  this->usePhaseInterpolation = dVar5 != downsampleFactor;
  __n = (ulong)kernelLength * 4;
  __dest = (FIRCoefficient *)operator_new__(__n);
  memcpy(__dest,kernel,__n);
  this->taps = __dest;
  this->numberOfTaps = kernelLength;
  this->numberOfPhases = upsampleFactor;
  this->phaseIncrement = downsampleFactor;
  dVar5 = ceil((double)kernelLength / (double)upsampleFactor);
  uVar2 = 2;
  do {
    uVar4 = uVar2;
    uVar2 = uVar4 * 2;
  } while (uVar4 < (uint)(long)dVar5);
  this->delayLineMask = uVar4 - 1;
  pFVar3 = (FloatSample *)operator_new__((ulong)uVar4 * 8);
  this->ringBuffer = (FloatSample (*) [2])pFVar3;
  pFVar1 = pFVar3 + (ulong)uVar4 * 2;
  for (; pFVar3 < pFVar1; pFVar3 = pFVar3 + 1) {
    *pFVar3 = 0.0;
  }
  return;
}

Assistant:

FIRResampler::Constants::Constants(const unsigned int upsampleFactor, const double downsampleFactor, const FIRCoefficient kernel[], const unsigned int kernelLength) {
	usePhaseInterpolation = downsampleFactor != floor(downsampleFactor);
	FIRCoefficient *kernelCopy = new FIRCoefficient[kernelLength];
	memcpy(kernelCopy, kernel, kernelLength * sizeof(FIRCoefficient));
	taps = kernelCopy;
	numberOfTaps = kernelLength;
	numberOfPhases = upsampleFactor;
	phaseIncrement = downsampleFactor;
	unsigned int minDelayLineLength = static_cast<unsigned int>(ceil(double(kernelLength) / upsampleFactor));
	unsigned int delayLineLength = 2;
	while (delayLineLength < minDelayLineLength) delayLineLength <<= 1;
	delayLineMask = delayLineLength - 1;
	ringBuffer = new FloatSample[delayLineLength][FIR_INTERPOLATOR_CHANNEL_COUNT];
	FloatSample *s = *ringBuffer;
	FloatSample *e = ringBuffer[delayLineLength];
	while (s < e) *(s++) = 0;
}